

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

bool __thiscall QLayout::isEmpty(QLayout *this)

{
  ulong uVar1;
  long *in_RDI;
  QLayoutItem *item;
  int i;
  long *local_20;
  int local_14;
  
  local_14 = 0;
  local_20 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,0);
  while( true ) {
    if (local_20 == (long *)0x0) {
      return true;
    }
    uVar1 = (**(code **)(*local_20 + 0x40))();
    if ((uVar1 & 1) == 0) break;
    local_14 = local_14 + 1;
    local_20 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_14);
  }
  return false;
}

Assistant:

bool QLayout::isEmpty() const
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (!item->isEmpty())
            return false;
        ++i;
        item = itemAt(i);
    }
    return true;
}